

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O0

void __thiscall HighsTimer::stop(HighsTimer *this,HighsInt i_clock)

{
  double dVar1;
  reference pvVar2;
  undefined8 uVar3;
  reference pvVar4;
  uint in_ESI;
  long in_RDI;
  double dVar5;
  double callClockTimes;
  double wall_time;
  bool clock_stopped;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),(long)(int)in_ESI);
  if (0.0 < *pvVar2) {
    in_stack_ffffffffffffffd4 = in_ESI;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x60),(long)(int)in_ESI);
    uVar3 = std::__cxx11::string::c_str();
    printf("Clock %d - %s - not running\n",(ulong)in_stack_ffffffffffffffd4,uVar3);
  }
  dVar5 = getWallTime((HighsTimer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),(long)(int)in_ESI);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),(long)(int)in_ESI);
  *pvVar2 = dVar5 + dVar1 + *pvVar2;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x18),(long)(int)in_ESI);
  *pvVar4 = *pvVar4 + 1;
  if (in_ESI == 0xffffffd2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x60),0xffffffffffffffd2);
    uVar3 = std::__cxx11::string::c_str();
    printf("HighsTimer: stopping clock %d: %s\n",0xffffffd2,uVar3);
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),(long)(int)in_ESI);
  *pvVar2 = dVar5;
  return;
}

Assistant:

void stop(const HighsInt i_clock = 0  //!< Index of the clock to be stopped
  ) {
    assert(i_clock >= 0);
    assert(i_clock < num_clock);
    // Check that the clock's been started. It should be set to
    // -getWallTime() <= 0
    const bool clock_stopped = clock_start[i_clock] > 0;
    if (clock_stopped) {
      printf("Clock %d - %s - not running\n", int(i_clock),
             clock_names[i_clock].c_str());
    }
    assert(!clock_stopped);
    double wall_time = getWallTime();
    double callClockTimes = wall_time + clock_start[i_clock];
    clock_time[i_clock] += callClockTimes;
    clock_num_call[i_clock]++;
    // Set the start to be the WallTick to check that the clock's been
    // stopped when it's next started
    if (i_clock == check_clock) {
      printf("HighsTimer: stopping clock %d: %s\n", int(check_clock),
             this->clock_names[check_clock].c_str());
    }
    clock_start[i_clock] = wall_time;
  }